

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

void __thiscall
ut11::Mock<void(std::exception)>::Verify<ut11::Operands::IsAny<std::exception>>
          (Mock<void(std::exception)> *this,size_t line,string *file,
          IsAny<std::exception> *expectations)

{
  pointer pcVar1;
  long lVar2;
  Mock<void(std::exception)> *pMVar3;
  size_type __dnew;
  size_type local_60;
  string local_58;
  string local_38;
  
  lVar2 = 1;
  pMVar3 = this + 0x20;
  do {
    pMVar3 = *(Mock<void(std::exception)> **)pMVar3;
    lVar2 = lVar2 + -1;
  } while (pMVar3 != this + 0x20);
  if (lVar2 == 0) {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + file->_M_string_length);
    local_60 = 0x24;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
    local_58.field_2._M_allocated_capacity = local_60;
    builtin_strncpy(local_58._M_dataplus._M_p,"Expected function call was not found",0x24);
    local_58._M_string_length = local_60;
    local_58._M_dataplus._M_p[local_60] = '\0';
    Assert::Fail(line,&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Verify(std::size_t line, std::string file, const Expectations&... expectations) const
		{
			if ( m_argumentHandler.CountCalls(expectations...) == 0 )
				Assert::Fail(line, file, GetVerifyFailMessage());
		}